

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void nullcPrintFunctionPointerInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  int iVar1;
  char *pcVar2;
  ExternTypeInfo *pEVar3;
  ExternFuncInfo *pEVar4;
  ExternMemberInfo *pEVar5;
  ExternLocalInfo *pEVar6;
  uint uVar7;
  char *pcVar8;
  uint arg;
  uint uVar9;
  
  pcVar2 = nullcDebugSymbols((uint *)0x0);
  pEVar3 = nullcDebugTypeInfo((uint *)0x0);
  pEVar4 = nullcDebugFunctionInfo((uint *)0x0);
  pEVar5 = nullcDebugTypeExtraInfo((uint *)0x0);
  pEVar6 = nullcDebugLocalInfo((uint *)0x0);
  iVar1 = *(int *)(ptr + 8);
  uVar9 = pEVar5[(type->field_11).subType].type;
  nullcPrintDepthIndent(indentDepth);
  printf("function %d %s %s(",(ulong)*(uint *)(ptr + 8),pcVar2 + pEVar3[uVar9].offsetToName,
         pcVar2 + pEVar4[iVar1].offsetToName);
  for (uVar9 = 0; uVar9 < pEVar4[iVar1].paramCount; uVar9 = uVar9 + 1) {
    uVar7 = pEVar4[iVar1].offsetToFirstLocal + uVar9;
    pcVar8 = ", ";
    if (uVar9 == pEVar4[iVar1].paramCount - 1) {
      pcVar8 = "";
    }
    printf("%s %s%s",pcVar2 + pEVar3[pEVar6[uVar7].type].offsetToName,
           pcVar2 + pEVar6[uVar7].offsetToName,pcVar8);
  }
  puts(")");
  nullcPrintDepthIndent(indentDepth);
  if ((ulong)pEVar4[iVar1].contextType == 0xffffffff) {
    pcVar2 = "void ref";
  }
  else {
    pcVar2 = pcVar2 + pEVar3[pEVar4[iVar1].contextType].offsetToName;
  }
  printf("%s context = %p\n",pcVar2,*(undefined8 *)ptr);
  if (*(char **)ptr != (char *)0x0) {
    nullcPrintVariableInfo
              (pEVar3 + pEVar3[pEVar4[iVar1].contextType].field_11.subType,*(char **)ptr,
               indentDepth + 1);
    return;
  }
  return;
}

Assistant:

void nullcPrintFunctionPointerInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);
	ExternFuncInfo *codeFunctions = nullcDebugFunctionInfo(NULL);
	ExternMemberInfo *codeTypeExtra = nullcDebugTypeExtraInfo(NULL);
	ExternLocalInfo *codeLocals = nullcDebugLocalInfo(NULL);

	ExternFuncInfo &func = codeFunctions[*(int*)(ptr + NULLC_PTR_SIZE)];
	ExternTypeInfo &returnType = codeTypes[codeTypeExtra[type.memberOffset].type];

	nullcPrintDepthIndent(indentDepth);
	printf("function %d %s %s(", *(int*)(ptr + NULLC_PTR_SIZE), codeSymbols + returnType.offsetToName, codeSymbols + func.offsetToName);
	for(unsigned arg = 0; arg < func.paramCount; arg++)
	{
		ExternLocalInfo &lInfo = codeLocals[func.offsetToFirstLocal + arg];
		printf("%s %s%s", codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName, arg == func.paramCount - 1 ? "" : ", ");
	}
	printf(")\n");

	nullcPrintDepthIndent(indentDepth);
	printf("%s context = %p\n", func.contextType == ~0u ? "void ref" : codeSymbols + codeTypes[func.contextType].offsetToName, *(void**)(ptr));

	if(*(char**)(ptr))
		nullcPrintVariableInfo(codeTypes[codeTypes[func.contextType].subType], *(char**)(ptr), indentDepth + 1);
}